

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

void DoAttack(AActor *self,bool domelee,bool domissile,int MeleeDamage,FSoundID *MeleeSound,
             PClassActor *MissileType,double MissileHeight)

{
  bool bVar1;
  int damage;
  int iVar2;
  AActor *pAVar3;
  TObjPtr<AActor> *obj;
  DAngle angle;
  double dVar4;
  FName local_58;
  FSoundID local_54;
  undefined8 local_50;
  DVector3 local_48;
  
  obj = &self->target;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar3 != (AActor *)0x0) {
    A_FaceTarget(self);
    if ((domelee && 0 < MeleeDamage) && (bVar1 = AActor::CheckMeleeRange(self), bVar1)) {
      damage = FRandom::HitDice(&pr_camelee,MeleeDamage);
      if (MeleeSound->ID != 0) {
        local_54.ID = MeleeSound->ID;
        S_Sound(self,1,&local_54,1.0,1.0);
      }
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      local_58.Index = 0x89;
      local_50 = 0;
      iVar2 = P_DamageMobj(pAVar3,self,self,damage,&local_58,0,angle);
      if (0 < iVar2) {
        damage = iVar2;
      }
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      P_TraceBleed(damage,pAVar3,self);
      return;
    }
    if (domissile && MissileType != (PClassActor *)0x0) {
      dVar4 = AActor::GetBobOffset(self,0.0);
      dVar4 = dVar4 + MissileHeight + -32.0;
      local_48.Z = (self->__Pos).Z + dVar4;
      (self->__Pos).Z = local_48.Z;
      local_48.Z = local_48.Z + 32.0;
      local_48.X = (self->__Pos).X;
      local_48.Y = (self->__Pos).Y;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar3 = P_SpawnMissileXYZ(&local_48,self,pAVar3,MissileType,false,(AActor *)0x0);
      (self->__Pos).Z = (self->__Pos).Z - dVar4;
      if (pAVar3 != (AActor *)0x0) {
        if (((pAVar3->flags2).Value & 0x40000000) != 0) {
          (pAVar3->tracer).field_0 = obj->field_0;
        }
        P_CheckMissileSpawn(pAVar3,self->radius);
      }
    }
  }
  return;
}

Assistant:

static void DoAttack (AActor *self, bool domelee, bool domissile,
					  int MeleeDamage, FSoundID MeleeSound, PClassActor *MissileType,double MissileHeight)
{
	if (self->target == NULL) return;

	A_FaceTarget (self);
	if (domelee && MeleeDamage>0 && self->CheckMeleeRange ())
	{
		int damage = pr_camelee.HitDice(MeleeDamage);
		if (MeleeSound) S_Sound (self, CHAN_WEAPON, MeleeSound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else if (domissile && MissileType != NULL)
	{
		// This seemingly senseless code is needed for proper aiming.
		double add = MissileHeight + self->GetBobOffset() - 32;
		self->AddZ(add);
		AActor *missile = P_SpawnMissileXYZ (self->PosPlusZ(32.), self, self->target, MissileType, false);
		self->AddZ(-add);

		if (missile)
		{
			// automatic handling of seeker missiles
			if (missile->flags2&MF2_SEEKERMISSILE)
			{
				missile->tracer=self->target;
			}
			P_CheckMissileSpawn(missile, self->radius);
		}
	}
}